

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_parser_scansup.cpp
# Opt level: O1

char * duckdb_libpgquery::downcase_identifier(char *ident,int len,bool warn,bool truncate)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  
  pcVar4 = (char *)palloc((long)(len + 1));
  iVar2 = pg_database_encoding_max_length();
  if (len < 1) {
    uVar6 = 0;
  }
  else {
    lVar5 = __tls_get_addr(&PTR_024cc0b0);
    cVar1 = *(char *)(lVar5 + 0x2a80);
    uVar6 = 0;
    do {
      bVar7 = ident[uVar6];
      if (cVar1 == '\0') {
        if ((byte)(bVar7 + 0xbf) < 0x1a) {
          bVar7 = bVar7 | 0x20;
        }
        else if ((char)bVar7 < '\0' && iVar2 == 1) {
          iVar3 = isupper((uint)bVar7);
          if (iVar3 != 0) {
            iVar3 = tolower((uint)bVar7);
            bVar7 = (byte)iVar3;
          }
        }
      }
      pcVar4[uVar6] = bVar7;
      uVar6 = uVar6 + 1;
    } while ((uint)len != uVar6);
  }
  pcVar4[uVar6] = '\0';
  return pcVar4;
}

Assistant:

char *downcase_identifier(const char *ident, int len, bool warn, bool truncate) {
	char *result;
	int i;
	bool enc_is_single_byte;

	result = (char *)palloc(len + 1);
	enc_is_single_byte = pg_database_encoding_max_length() == 1;

	/*
	 * SQL99 specifies Unicode-aware case normalization, which we don't yet
	 * have the infrastructure for.  Instead we use tolower() to provide a
	 * locale-aware translation.  However, there are some locales where this
	 * is not right either (eg, Turkish may do strange things with 'i' and
	 * 'I').  Our current compromise is to use tolower() for characters with
	 * the high bit set, as long as they aren't part of a multi-byte
	 * character, and use an ASCII-only downcasing for 7-bit characters.
	 */
	for (i = 0; i < len; i++) {
		unsigned char ch = (unsigned char)ident[i];

		if (!get_preserve_identifier_case()) {
			if (ch >= 'A' && ch <= 'Z')
				ch += 'a' - 'A';
			else if (enc_is_single_byte && IS_HIGHBIT_SET(ch) && isupper(ch))
				ch = tolower(ch);
		}
		result[i] = (char)ch;
	}
	result[i] = '\0';

	return result;
}